

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile.c
# Opt level: O3

void writesf_free(t_writesf *x)

{
  pthread_mutex_t *__mutex;
  pthread_cond_t *__cond;
  int iVar1;
  void *threadrtn;
  void *pvStack_28;
  
  __mutex = &x->x_mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  x->x_requestcode = REQUEST_QUIT;
  __cond = &x->x_requestcondition;
  pthread_cond_signal((pthread_cond_t *)__cond);
  if (x->x_requestcode != REQUEST_NOTHING) {
    do {
      pthread_cond_signal((pthread_cond_t *)__cond);
      pthread_cond_wait((pthread_cond_t *)&x->x_answercondition,(pthread_mutex_t *)__mutex);
    } while (x->x_requestcode != REQUEST_NOTHING);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  iVar1 = pthread_join(x->x_childthread,&pvStack_28);
  if (iVar1 != 0) {
    pd_error(x,"writesf_free: join failed");
  }
  pthread_cond_destroy((pthread_cond_t *)__cond);
  pthread_cond_destroy((pthread_cond_t *)&x->x_answercondition);
  pthread_mutex_destroy((pthread_mutex_t *)__mutex);
  freebytes(x->x_buf,(long)x->x_bufsize);
  return;
}

Assistant:

static void writesf_free(t_writesf *x)
{
    void *threadrtn;
    pthread_mutex_lock(&x->x_mutex);
    x->x_requestcode = REQUEST_QUIT;
#ifdef DEBUG_SOUNDFILE_THREADS
    fprintf(stderr, "writesf~: stopping thread...\n");
#endif
    sfread_cond_signal(&x->x_requestcondition);
    while (x->x_requestcode != REQUEST_NOTHING)
    {
#ifdef DEBUG_SOUNDFILE_THREADS
        fprintf(stderr, "writesf~: signaling...\n");
#endif
        sfread_cond_signal(&x->x_requestcondition);
        sfread_cond_wait(&x->x_answercondition, &x->x_mutex);
    }
    pthread_mutex_unlock(&x->x_mutex);
    if (pthread_join(x->x_childthread, &threadrtn))
        pd_error(x, "writesf_free: join failed");
#ifdef DEBUG_SOUNDFILE_THREADS
    fprintf(stderr, "writesf~: ... done\n");
#endif

    pthread_cond_destroy(&x->x_requestcondition);
    pthread_cond_destroy(&x->x_answercondition);
    pthread_mutex_destroy(&x->x_mutex);
    freebytes(x->x_buf, x->x_bufsize);
}